

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
MipsDisassembler_getInstruction
          (int mode,MCInst *instr,uint8_t *code,size_t code_len,uint16_t *Size,uint64_t Address,
          _Bool isBigEndian,MCRegisterInfo *MRI)

{
  DecodeStatus DVar1;
  uint32_t local_40;
  DecodeStatus Result;
  uint32_t Insn;
  _Bool isBigEndian_local;
  uint64_t Address_local;
  uint16_t *Size_local;
  size_t code_len_local;
  uint8_t *code_local;
  MCInst *instr_local;
  int mode_local;
  
  Result._3_1_ = isBigEndian;
  if (code_len < 4) {
    instr_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    _Insn = Address;
    Address_local = (uint64_t)Size;
    Size_local = (uint16_t *)code_len;
    code_len_local = (size_t)code;
    code_local = (uint8_t *)instr;
    instr_local._0_4_ = mode;
    if (instr->flat_insn->detail != (cs_detail *)0x0) {
      memset(instr->flat_insn->detail,0,0x5f8);
    }
    DVar1 = readInstruction32((uchar *)code_len_local,&local_40,(_Bool)(Result._3_1_ & 1),
                              ((uint)instr_local & 0x10) != 0);
    if (DVar1 == MCDisassembler_Fail) {
      instr_local._4_4_ = MCDisassembler_Fail;
    }
    else if (((uint)instr_local & 0x10) == 0) {
      if (((((uint)instr_local & 0x40) == 0) || (((uint)instr_local & 0x80) == 0)) ||
         (instr_local._4_4_ =
               decodeInstruction(DecoderTableMips32r6_64r6_GP6432,(MCInst *)code_local,local_40,
                                 _Insn,MRI,(uint)instr_local),
         instr_local._4_4_ == MCDisassembler_Fail)) {
        if ((((uint)instr_local & 0x40) == 0) ||
           (instr_local._4_4_ =
                 decodeInstruction(DecoderTableMips32r6_64r632,(MCInst *)code_local,local_40,_Insn,
                                   MRI,(uint)instr_local), instr_local._4_4_ == MCDisassembler_Fail)
           ) {
          instr_local._4_4_ =
               decodeInstruction(DecoderTableMips32,(MCInst *)code_local,local_40,_Insn,MRI,
                                 (uint)instr_local);
          if (instr_local._4_4_ == MCDisassembler_Fail) {
            instr_local._4_4_ = MCDisassembler_Fail;
          }
          else {
            *(undefined2 *)Address_local = 4;
          }
        }
        else {
          *(undefined2 *)Address_local = 4;
        }
      }
      else {
        *(undefined2 *)Address_local = 4;
      }
    }
    else {
      instr_local._4_4_ =
           decodeInstruction(DecoderTableMicroMips32,(MCInst *)code_local,local_40,_Insn,MRI,
                             (uint)instr_local);
      if (instr_local._4_4_ == MCDisassembler_Fail) {
        instr_local._4_4_ = MCDisassembler_Fail;
      }
      else {
        *(undefined2 *)Address_local = 4;
      }
    }
  }
  return instr_local._4_4_;
}

Assistant:

static DecodeStatus MipsDisassembler_getInstruction(int mode, MCInst *instr,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, bool isBigEndian, MCRegisterInfo *MRI)
{
	uint32_t Insn;
	DecodeStatus Result;

	if (code_len < 4)
		// not enough data
		return MCDisassembler_Fail;

	if (instr->flat_insn->detail) {
		memset(instr->flat_insn->detail, 0, sizeof(cs_detail));
	}

	Result = readInstruction32((unsigned char*)code, &Insn, isBigEndian,
			mode & CS_MODE_MICRO);
	if (Result == MCDisassembler_Fail)
		return MCDisassembler_Fail;

	if (mode & CS_MODE_MICRO) {
		// Calling the auto-generated decoder function.
		Result = decodeInstruction(DecoderTableMicroMips32, instr, Insn, Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
		return MCDisassembler_Fail;
	}

#if 0
	// TODO: properly handle this in the future with MIPS1/2 modes
	if (((mode & CS_MODE_32) == 0) && ((mode & CS_MODE_MIPS3) == 0)) {	// COP3
		// DEBUG(dbgs() << "Trying COP3_ table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableCOP3_32, instr, Insn, Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}
#endif

	if (((mode & CS_MODE_MIPS32R6) != 0) && ((mode & CS_MODE_MIPSGP64) != 0)) {
		// DEBUG(dbgs() << "Trying Mips32r6_64r6 (GPR64) table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableMips32r6_64r6_GP6432, instr, Insn,
				Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}

	if ((mode & CS_MODE_MIPS32R6) != 0) {
		// DEBUG(dbgs() << "Trying Mips32r6_64r6 table (32-bit opcodes):\n");
		Result = decodeInstruction(DecoderTableMips32r6_64r632, instr, Insn,
				Address, MRI, mode);
		if (Result != MCDisassembler_Fail) {
			*Size = 4;
			return Result;
		}
	}

	// Calling the auto-generated decoder function.
	Result = decodeInstruction(DecoderTableMips32, instr, Insn, Address, MRI, mode);
	if (Result != MCDisassembler_Fail) {
		*Size = 4;
		return Result;
	}

	return MCDisassembler_Fail;
}